

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O1

void __thiscall
BVFixed::SetRange<Js::LoopFlags>(BVFixed *this,LoopFlags *value,BVIndex start,BVIndex len)

{
  ulong *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  ulong uVar6;
  sbyte sVar7;
  BVFixed *pBVar8;
  ulong *puVar9;
  LoopFlags *pLVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  BVIndex i;
  uint uVar14;
  ulong local_38;
  BVUnitTContainer temp;
  
  AssertRange(this,start);
  if (len != 0) {
    if (8 < len) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.h"
                         ,0xf2,"(len <= sizeof(Container) * MachBits)",
                         "len <= sizeof(Container) * MachBits");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    i = (len + start) - 1;
    AssertRange(this,i);
    uVar12 = start >> 6;
    uVar6 = (ulong)uVar12;
    uVar13 = i >> 6;
    uVar14 = i & 0x3f;
    local_38 = (ulong)(byte)*value;
    sVar7 = (sbyte)(start & 0x3f);
    if (uVar13 == uVar12) {
      uVar5 = ~(-1L << ((char)(uVar14 + 1) - sVar7 & 0x3fU));
      if (uVar14 + 1 == 0x40) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar6 = uVar5 << sVar7;
      uVar11 = local_38 << sVar7;
      pBVar8 = this + (ulong)uVar12 + 1;
      uVar5 = (local_38 & uVar5) << sVar7 | (ulong)*pBVar8;
      pLVar10 = (LoopFlags *)&local_38;
    }
    else if ((start & 0x3f) == 0) {
      if (uVar12 < uVar13) {
        memcpy((void *)((long)&this[1].len + (ulong)(start >> 3)),&local_38,
               (ulong)(~uVar12 + uVar13) * 8 + 8);
        pLVar10 = (LoopFlags *)(&temp + (~uVar12 + uVar13));
      }
      else {
        pLVar10 = (LoopFlags *)&local_38;
      }
      uVar6 = ~(-1L << ((byte)(uVar14 + 1) & 0x3f));
      if (uVar14 + 1 == 0x40) {
        uVar6 = 0xffffffffffffffff;
      }
      pBVar8 = this + (ulong)uVar13 + 1;
      uVar11 = *(ulong *)pLVar10;
      uVar5 = uVar11 & uVar6 | (ulong)*pBVar8;
    }
    else {
      this[(ulong)uVar12 + 1] =
           (BVFixed)(~(-1L << sVar7) & (ulong)this[(ulong)uVar12 + 1] | local_38 << sVar7);
      if (uVar12 + 1 < uVar13) {
        puVar9 = &local_38;
        do {
          uVar11 = *puVar9;
          puVar1 = puVar9 + 1;
          puVar9 = puVar9 + 1;
          this[uVar6 + 2] = (BVFixed)(*puVar1 << sVar7 | uVar11 >> (0x40U - sVar7 & 0x3f));
          uVar6 = uVar6 + 1;
        } while ((ulong)uVar13 - 1 != uVar6);
      }
      else {
        puVar9 = &local_38;
      }
      pLVar10 = (LoopFlags *)(puVar9 + 1);
      uVar11 = puVar9[1] << sVar7 | *puVar9 >> (0x40U - sVar7 & 0x3f);
      uVar6 = ~(-1L << ((byte)(uVar14 + 1) & 0x3f));
      if (uVar14 + 1 == 0x40) {
        uVar6 = 0xffffffffffffffff;
      }
      pBVar8 = this + (ulong)uVar13 + 1;
      uVar5 = uVar11 & uVar6 | (ulong)*pBVar8;
    }
    *pBVar8 = (BVFixed)((~uVar6 | uVar11) & uVar5);
    local_38 = (long)(char)pLVar10[1] + (long)(char)*pLVar10;
    *value = *pLVar10;
  }
  return;
}

Assistant:

void BVFixed::SetRange(Container* value, BVIndex start, BVIndex len)
{
    AssertRange(start);
    if (len == 0)
    {
        return;
    }
    Assert(len <= sizeof(Container) * MachBits);
    BVIndex end = start + len - 1;
    AssertRange(end);
    BVIndex iStart = BVUnit::Position(start);
    BVIndex iEnd = BVUnit::Position(end);
    BVIndex oStart = BVUnit::Offset(start);
    BVIndex oEnd = BVUnit::Offset(end);

    BVUnit::BVUnitTContainer temp;
    BVUnit::BVUnitTContainer* bits;
    static_assert(sizeof(Container) == 1 || sizeof(Container) == sizeof(BVUnit::BVUnitTContainer),
        "Container is not suitable to represent the calculated value");
    if (sizeof(Container) == 1)
    {
        static_assert(sizeof(byte) == 1, "Size of byte should be 1.");
        temp = *(byte*)value;
        bits = &temp;
    }
    else
    {
        bits = (BVUnit::BVUnitTContainer*)value;
    }
    const int oStartComplement = BVUnit::BitsPerWord - oStart;
    static_assert((BVUnit::BVUnitTContainer)BVUnit::AllOnesMask > 0, "Container type of BVFixed must be unsigned");
    //When making the mask, check the special case when we need all bits
#define MAKE_MASK(start, end) ( ((end) == BVUnit::BitsPerWord ? BVUnit::AllOnesMask : (((BVUnit::BVUnitTContainer)1 << ((end) - (start))) - 1))   << (start))
    // Or the value to set the bits to 1. And the value to set the bits to 0
    // The mask is used to make sure we don't modify the bits outside the range
#define SET_RANGE(i, value, mask) \
    this->data[i].Or((value) & mask);\
    this->data[i].And((value) | ~mask);

    BVUnit::BVUnitTContainer bitsToSet;
    // Fast Path
    if (iEnd == iStart)
    {
        const BVUnit::BVUnitTContainer mask = MAKE_MASK(oStart, oEnd + 1);
        // Shift to position the bits
        bitsToSet = (*bits << oStart);
        SET_RANGE(iStart, bitsToSet, mask);
    }
    // TODO: case iEnd == iStart + 1 to avoid a loop
    else if (oStart == 0)
    {
        // Simpler case where we don't have to shift the bits around
        for (uint i = iStart; i < iEnd; ++i)
        {
            SET_RANGE(i, *bits, BVUnit::AllOnesMask);
            ++bits;
        }
        // We still need to use a mask to remove the unused bits
        const BVUnit::BVUnitTContainer mask = MAKE_MASK(0, oEnd + 1);
        SET_RANGE(iEnd, *bits, mask);
    }
    else
    {
        // Default case. We need to process everything 1 at a time
        {
            // First set the first bits
CLANG_WNO_BEGIN("-Wtautological-compare")
            const BVUnit::BVUnitTContainer mask = MAKE_MASK(oStart, BVUnit::BitsPerWord);
CLANG_WNO_END
            SET_RANGE(iStart, *bits << oStart, mask);
        }
        // Set the bits in the middle
        for (uint i = iStart + 1; i < iEnd; ++i)
        {
            bitsToSet = *bits >> oStartComplement;
            ++bits;
            bitsToSet |= *bits << oStart;
            SET_RANGE(i, bitsToSet, BVUnit::AllOnesMask);
        }
        // Set the last bits
        bitsToSet = *bits >> oStartComplement;
        ++bits;
        bitsToSet |= *bits << oStart;
        {
            const BVUnit::BVUnitTContainer mask = MAKE_MASK(0, oEnd + 1);
            SET_RANGE(iEnd, bitsToSet, mask);
        }
    }

    if (sizeof(Container) == 1)
    {
        // Calculation above might overflow the original container.
        // normalize the overflow value. LE only
        temp = (*((char*)bits)) + (*(((char*)bits) + 1));
        memcpy(value, bits, 1);
    }
#undef MAKE_MASK
#undef SET_RANGE
}